

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.c
# Opt level: O0

int wally_elements_pegout_script_size
              (size_t genesis_blockhash_len,size_t mainchain_script_len,size_t sub_pubkey_len,
              size_t whitelistproof_len,size_t *written)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  size_t *written_local;
  size_t whitelistproof_len_local;
  size_t sub_pubkey_len_local;
  size_t mainchain_script_len_local;
  size_t genesis_blockhash_len_local;
  
  sVar1 = script_get_push_size(genesis_blockhash_len);
  sVar2 = script_get_push_size(mainchain_script_len);
  sVar3 = script_get_push_size(sub_pubkey_len);
  sVar4 = script_get_push_size(whitelistproof_len);
  *written = sVar1 + 1 + sVar2 + sVar3 + sVar4;
  return 0;
}

Assistant:

int wally_elements_pegout_script_size(size_t genesis_blockhash_len,
                                      size_t mainchain_script_len,
                                      size_t sub_pubkey_len,
                                      size_t whitelistproof_len,
                                      size_t *written)
{
    *written = 1
               + script_get_push_size(genesis_blockhash_len)
               + script_get_push_size(mainchain_script_len)
               + script_get_push_size(sub_pubkey_len)
               + script_get_push_size(whitelistproof_len);
    return WALLY_OK;
}